

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TscClock.cpp
# Opt level: O3

int main(void)

{
  __atomic_base<unsigned_long> _Var1;
  ulong uVar2;
  cx_string<2UL> cVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t sVar5;
  undefined4 uVar7;
  undefined8 uVar6;
  pthread_mutex_t *__mutex;
  bool bVar8;
  ClockSync tscSync;
  ClockSync systemClockSync;
  SessionWriter writer;
  Session session;
  ofstream logfile;
  int local_488;
  cx_string<1UL> local_482;
  string local_480;
  undefined1 local_460 [16];
  _Alloc_hider local_450;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_440;
  _Alloc_hider local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420;
  _Alloc_hider local_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_400;
  uint64_t local_3f0;
  _Alloc_hider local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  _Alloc_hider local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  undefined1 local_3a8 [32];
  _Alloc_hider local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378 [2];
  uint64_t local_358;
  int32_t local_350;
  long *local_348;
  long local_340;
  long local_338 [2];
  ConsumeResult local_328;
  SessionWriter local_308;
  pthread_mutex_t local_2d8;
  vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
  local_2b0;
  RecoverableVectorOutputStream local_298;
  undefined8 *local_280;
  long local_270;
  undefined1 local_24e;
  void *local_248;
  long local_238;
  long local_230;
  filebuf local_228 [24];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,"tscclock.blog",_S_out|_S_bin);
  binlog::Session::Session((Session *)&local_2d8.__data);
  uVar2 = rdtsc();
  binlog::systemClockSync();
  __mutex = (pthread_mutex_t *)(uVar2 & 0xffffffff00000000);
  local_3a8._0_8_ = CONCAT44(extraout_var,(int)uVar2) | (ulong)__mutex;
  local_3a8._8_8_ = 3000000000;
  local_3a8._16_8_ = local_358;
  local_3a8._24_4_ = local_350;
  local_388._M_p = (pointer)local_378;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_388,local_348,local_340 + (long)local_348);
  iVar4 = pthread_mutex_lock(&local_2d8);
  if (iVar4 == 0) {
    binlog::
    serializeSizePrefixedTagged<binlog::ClockSync,binlog::detail::RecoverableVectorOutputStream>
              ((ClockSync *)local_3a8,&local_298);
    local_24e = 1;
    pthread_mutex_unlock(&local_2d8);
    local_480._M_string_length = 0;
    local_480.field_2._M_local_buf[0] = '\0';
    local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
    binlog::SessionWriter::SessionWriter
              (&local_308,(Session *)&local_2d8.__data,0x100000,0,&local_480);
    uVar7 = extraout_var_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_480._M_dataplus._M_p != &local_480.field_2) {
      operator_delete(local_480._M_dataplus._M_p,
                      CONCAT71(local_480.field_2._M_allocated_capacity._1_7_,
                               local_480.field_2._M_local_buf[0]) + 1);
      uVar7 = extraout_var_01;
    }
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      local_460._0_8_ = 0;
      local_460._8_2_ = info;
      local_450._M_p = (pointer)&local_440;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"main","");
      local_430._M_p = (pointer)&local_420;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"main","");
      local_410._M_p = (pointer)&local_400;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_410,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/example/TscClock.cpp"
                 ,"");
      local_3f0 = 0x3f;
      local_3e8._M_p = (pointer)&local_3d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"a={}, b={}","");
      local_488 = CONCAT22(local_488._2_2_,0x69);
      local_482._data[0] = 'i';
      local_482._data[1] = '\0';
      cVar3 = mserialize::cx_strcat<1ul,1ul>((cx_string<1UL> *)&local_488,&local_482);
      local_328.bytesConsumed._0_4_ = CONCAT13(local_328.bytesConsumed._3_1_,cVar3._data);
      local_3c8._M_p = (pointer)&local_3b8;
      sVar5 = strlen((char *)&local_328);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3c8,&local_328,(long)&local_328.bytesConsumed + sVar5);
      iVar4 = pthread_mutex_lock((pthread_mutex_t *)local_308._session);
      __mutex = (pthread_mutex_t *)local_308._session;
      if (iVar4 != 0) goto LAB_00102891;
      local_460._0_8_ = ((pthread_mutex_t *)((long)local_308._session + 0x78))->__align;
      binlog::
      serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                ((EventSource *)local_460,
                 (RecoverableVectorOutputStream *)((long)local_308._session + 0x58));
      _Var1._M_i = ((pthread_mutex_t *)((long)local_308._session + 0x78))->__align;
      ((pthread_mutex_t *)((long)local_308._session + 0x78))->__align = _Var1._M_i + 1;
      pthread_mutex_unlock((pthread_mutex_t *)local_308._session);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_p != &local_3b8) {
        operator_delete(local_3c8._M_p,local_3b8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_p != &local_3d8) {
        operator_delete(local_3e8._M_p,local_3d8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_p != &local_400) {
        operator_delete(local_410._M_p,local_400._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_p != &local_420) {
        operator_delete(local_430._M_p,local_420._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_p != &local_440) {
        operator_delete(local_450._M_p,local_440._M_allocated_capacity + 1);
      }
      LOCK();
      uVar7 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i._4_4_;
      UNLOCK();
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var1._M_i;
    }
    uVar2 = rdtsc();
    local_328.bytesConsumed._0_4_ = 0x7b;
    local_488 = 0x1c8;
    binlog::SessionWriter::addEvent<int,int>
              (&local_308,(uint64_t)main::_binlog_sid.super___atomic_base<unsigned_long>._M_i,
               uVar2 & 0xffffffff00000000 | CONCAT44(uVar7,(int)uVar2),(int *)&local_328,&local_488)
    ;
    binlog::Session::consume<std::ofstream>
              (&local_328,(Session *)&local_2d8.__data,
               (basic_ofstream<char,_std::char_traits<char>_> *)&local_230);
    bVar8 = (abStack_210[*(long *)(local_230 + -0x18)] & 5) == 0;
    if (bVar8) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Binary log written to tscclock.blog\n",0x24);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Failed to write tscclock.blog\n",0x1e);
    }
    if (local_308._channel.super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_308._channel.
                 super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_p != local_378) {
      operator_delete(local_388._M_p,local_378[0]._M_allocated_capacity + 1);
    }
    if (local_348 != local_338) {
      operator_delete(local_348,local_338[0] + 1);
    }
    if (local_248 != (void *)0x0) {
      operator_delete(local_248,local_238 - (long)local_248);
    }
    *local_280 = 0;
    if (local_280 != (undefined8 *)0x0) {
      operator_delete(local_280,local_270 - (long)local_280);
    }
    local_298._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start[0] = '\0';
    local_298._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = '\0';
    local_298._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start[2] = '\0';
    local_298._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start[3] = '\0';
    local_298._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start[4] = '\0';
    local_298._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start[5] = '\0';
    local_298._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start[6] = '\0';
    local_298._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start[7] = '\0';
    if (local_298._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_298._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_298._vector.super__Vector_base<char,_std::allocator<char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_298._vector.super__Vector_base<char,_std::allocator<char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
    ::~vector(&local_2b0);
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _strftime;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
    return (uint)!bVar8;
  }
  iVar4 = std::__throw_system_error(iVar4);
LAB_00102891:
  uVar6 = std::__throw_system_error(iVar4);
  pthread_mutex_unlock(__mutex);
  binlog::EventSource::~EventSource((EventSource *)local_460);
  if (local_308._channel.super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_308._channel.
               super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_p != local_378) {
    operator_delete(local_388._M_p,local_378[0]._M_allocated_capacity + 1);
  }
  if (local_348 != local_338) {
    operator_delete(local_348,local_338[0] + 1);
  }
  binlog::Session::~Session((Session *)&local_2d8.__data);
  std::ofstream::~ofstream(&local_230);
  _Unwind_Resume(uVar6);
}

Assistant:

int main()
{
  std::ofstream logfile("tscclock.blog", std::ofstream::out|std::ofstream::binary);

  binlog::Session session;

  // Create a ClockSync, that connects the TSC value to the wall clock time.
  const auto tscValue = __rdtsc();
  const binlog::ClockSync systemClockSync = binlog::systemClockSync();
  const binlog::ClockSync tscSync{
    tscValue,
    tscFrequency(),
    systemClockSync.nsSinceEpoch,
    systemClockSync.tzOffset,
    systemClockSync.tzName
  };

  // Add the created ClockSync to the metadata of the session.
  // Events consumed after this are assumed to be timestamped
  // with the clock defined by the ClockSync (this case, TSC)
  session.setClockSync(tscSync);

  // Add one event, consume the writer queue...

  binlog::SessionWriter writer(session);
  TSC_INFO_W(writer, "a={}, b={}", 123, 456);

  session.consume(logfile);

  if (! logfile)
  {
    std::cerr << "Failed to write tscclock.blog\n";
    return 1;
  }

  std::cout << "Binary log written to tscclock.blog\n";
  return 0;
}